

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::Copy(aiMeshMorphAnim **_dest,aiMeshMorphAnim *src)

{
  undefined1 auVar1 [16];
  aiMeshMorphAnim *this;
  ulong uVar2;
  uint *puVar3;
  double *pdVar4;
  uint local_24;
  ai_uint i;
  aiMeshMorphAnim *dest;
  aiMeshMorphAnim *src_local;
  aiMeshMorphAnim **_dest_local;
  
  if ((_dest != (aiMeshMorphAnim **)0x0) && (src != (aiMeshMorphAnim *)0x0)) {
    this = (aiMeshMorphAnim *)operator_new(0x410);
    aiMeshMorphAnim::aiMeshMorphAnim(this);
    *_dest = this;
    memcpy(this,src,0x410);
    GetArrayCopy<aiMeshMorphKey>(&this->mKeys,this->mNumKeys);
    for (local_24 = 0; local_24 < this->mNumKeys; local_24 = local_24 + 1) {
      auVar1 = ZEXT416(this->mKeys[local_24].mNumValuesAndWeights) * ZEXT816(4);
      uVar2 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      puVar3 = (uint *)operator_new__(uVar2);
      this->mKeys[local_24].mValues = puVar3;
      auVar1 = ZEXT416(this->mKeys[local_24].mNumValuesAndWeights) * ZEXT816(8);
      uVar2 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      pdVar4 = (double *)operator_new__(uVar2);
      this->mKeys[local_24].mWeights = pdVar4;
      memcpy(this->mKeys[local_24].mValues,src->mKeys[local_24].mValues,
             (ulong)this->mKeys[local_24].mNumValuesAndWeights << 2);
      memcpy(this->mKeys[local_24].mWeights,src->mKeys[local_24].mWeights,
             (ulong)this->mKeys[local_24].mNumValuesAndWeights << 3);
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiMeshMorphAnim** _dest, const aiMeshMorphAnim* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiMeshMorphAnim* dest = *_dest = new aiMeshMorphAnim();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiMeshMorphAnim));

    // and reallocate all arrays
    GetArrayCopy( dest->mKeys, dest->mNumKeys );
    for (ai_uint i = 0; i < dest->mNumKeys;++i) {
        dest->mKeys[i].mValues = new unsigned int[dest->mKeys[i].mNumValuesAndWeights];
        dest->mKeys[i].mWeights = new double[dest->mKeys[i].mNumValuesAndWeights];
        ::memcpy(dest->mKeys[i].mValues, src->mKeys[i].mValues, dest->mKeys[i].mNumValuesAndWeights * sizeof(unsigned int));
        ::memcpy(dest->mKeys[i].mWeights, src->mKeys[i].mWeights, dest->mKeys[i].mNumValuesAndWeights * sizeof(double));
    }
}